

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  ScriptModuleType SVar1;
  Command *pCVar2;
  WastParseOptions *pWVar3;
  _func_int **pp_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined8 uVar8;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  ScriptModuleType SVar29;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> _Var30;
  pointer pEVar31;
  Result RVar32;
  Result RVar33;
  Command *pCVar34;
  char *__function;
  Index IVar35;
  long lVar36;
  pointer pEVar37;
  long *plVar38;
  Module *out_module;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  pointer __p;
  Errors errors;
  ReadBinaryOptions options;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_b8;
  ScriptModule *local_b0;
  CommandPtr *local_a8;
  Script *local_a0;
  Errors local_98;
  undefined1 local_78 [32];
  long *local_58 [2];
  long local_48 [2];
  undefined1 local_38 [8];
  undefined1 uVar9;
  undefined1 uVar10;
  undefined3 uVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  undefined1 uVar14;
  undefined7 uVar17;
  undefined6 uVar19;
  undefined5 uVar21;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  
  local_b8._M_head_impl = (ScriptModule *)0x0;
  RVar32 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_b8);
  _Var30._M_head_impl = local_b8._M_head_impl;
  RVar33.enum_ = Error;
  if (RVar32.enum_ != Error) {
    SVar1 = (local_b8._M_head_impl)->type_;
    if (SVar1 == Quoted) {
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"a binary module","");
      plVar38 = local_48;
      local_58[0] = plVar38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"a text module","");
      local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 (string *)local_78,local_38);
      RVar33 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_98,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      lVar36 = -0x40;
      do {
        if (plVar38 != (long *)plVar38[-2]) {
          operator_delete((long *)plVar38[-2],*plVar38 + 1);
        }
        plVar38 = plVar38 + -4;
        lVar36 = lVar36 + 0x20;
      } while (lVar36 != 0);
    }
    else {
      if (SVar1 == Binary) {
        local_a8 = out_command;
        local_a0 = script;
        pCVar34 = (Command *)operator_new(0x388);
        memset(pCVar34,0,0x388);
        pCVar34->type = ScriptModule;
        pCVar34->_vptr_Command = (_func_int **)&PTR__ScriptModuleCommand_0018fb28;
        pCVar34[1]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[1].type = 0;
        *(undefined8 *)&pCVar34[1].field_0xc = 0;
        *(undefined8 *)((long)&pCVar34[2]._vptr_Command + 4) = 0;
        pCVar34[3]._vptr_Command = (_func_int **)(pCVar34 + 4);
        *(undefined8 *)&pCVar34[3].type = 0;
        *(undefined1 *)&pCVar34[4]._vptr_Command = 0;
        pCVar34[5]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[5].type = 0;
        pCVar34[6]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[6].type = 0;
        *(undefined8 *)&pCVar34[6].field_0xc = 0;
        *(undefined8 *)((long)&pCVar34[7]._vptr_Command + 4) = 0;
        memset(pCVar34 + 8,0,0x108);
        *(CommandType **)&pCVar34[0x18].type = &pCVar34[0x1b].type;
        pCVar34[0x19]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x19].type = 0;
        pCVar34[0x1a]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x1a].type = 0x3f800000;
        pCVar34[0x1b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x1b].type = 0;
        pCVar34[0x1c]._vptr_Command = (_func_int **)(pCVar34 + 0x1f);
        *(undefined8 *)&pCVar34[0x1c].type = 1;
        pCVar34[0x1d]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x1d].type = 0;
        *(undefined4 *)&pCVar34[0x1e]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x1e].type = 0;
        pCVar34[0x1f]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x1f].type = &pCVar34[0x22].type;
        pCVar34[0x20]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x20].type = 0;
        pCVar34[0x21]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x21].type = 0x3f800000;
        pCVar34[0x22]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x22].type = 0;
        pCVar34[0x23]._vptr_Command = (_func_int **)(pCVar34 + 0x26);
        *(undefined8 *)&pCVar34[0x23].type = 1;
        pCVar34[0x24]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x24].type = 0;
        *(undefined4 *)&pCVar34[0x25]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x25].type = 0;
        pCVar34[0x26]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x26].type = &pCVar34[0x29].type;
        pCVar34[0x27]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x27].type = 0;
        pCVar34[0x28]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x28].type = 0x3f800000;
        pCVar34[0x29]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x29].type = 0;
        pCVar34[0x2a]._vptr_Command = (_func_int **)(pCVar34 + 0x2d);
        *(undefined8 *)&pCVar34[0x2a].type = 1;
        pCVar34[0x2b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x2b].type = 0;
        *(undefined4 *)&pCVar34[0x2c]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x2c].type = 0;
        pCVar34[0x2d]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x2d].type = &pCVar34[0x30].type;
        pCVar34[0x2e]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x2e].type = 0;
        pCVar34[0x2f]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x2f].type = 0x3f800000;
        pCVar34[0x30]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x30].type = 0;
        pCVar34[0x31]._vptr_Command = (_func_int **)(pCVar34 + 0x34);
        *(undefined8 *)&pCVar34[0x31].type = 1;
        pCVar34[0x32]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x32].type = 0;
        *(undefined4 *)&pCVar34[0x33]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x33].type = 0;
        pCVar34[0x34]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x34].type = &pCVar34[0x37].type;
        pCVar34[0x35]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x35].type = 0;
        pCVar34[0x36]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x36].type = 0x3f800000;
        pCVar34[0x38]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x37]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x37].type = 0;
        if ((_Var30._M_head_impl)->type_ != Binary) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Binary>, Base = wabt::ScriptModule]"
          ;
LAB_001311c9:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x4e,__function);
        }
        out_module = (Module *)(pCVar34 + 1);
        local_78._24_8_ = (Stream *)0x0;
        local_58[0] = (long *)CONCAT44(local_58[0]._4_4_,0x10100);
        pWVar3 = this->options_;
        local_78[0x10] = (pWVar3->features).extended_const_enabled_;
        local_78[0x11] = (pWVar3->features).relaxed_simd_enabled_;
        uVar8._0_1_ = (pWVar3->features).exceptions_enabled_;
        uVar8._1_1_ = (pWVar3->features).mutable_globals_enabled_;
        uVar8._2_1_ = (pWVar3->features).sat_float_to_int_enabled_;
        uVar8._3_1_ = (pWVar3->features).sign_extension_enabled_;
        uVar9 = (pWVar3->features).simd_enabled_;
        uVar10 = (pWVar3->features).threads_enabled_;
        uVar12 = (pWVar3->features).function_references_enabled_;
        uVar14 = (pWVar3->features).multi_value_enabled_;
        uVar13 = CONCAT11(uVar14,uVar12);
        uVar11 = CONCAT21(uVar13,uVar10);
        uVar8._4_4_ = CONCAT31(uVar11,uVar9);
        uVar15 = (pWVar3->features).tail_call_enabled_;
        uVar16 = (pWVar3->features).bulk_memory_enabled_;
        uVar18 = (pWVar3->features).reference_types_enabled_;
        uVar20 = (pWVar3->features).annotations_enabled_;
        uVar22 = (pWVar3->features).code_metadata_enabled_;
        uVar24 = (pWVar3->features).gc_enabled_;
        uVar26 = (pWVar3->features).memory64_enabled_;
        uVar28 = (pWVar3->features).multi_memory_enabled_;
        uVar27 = CONCAT11(uVar28,uVar26);
        uVar25 = CONCAT21(uVar27,uVar24);
        uVar23 = CONCAT31(uVar25,uVar22);
        uVar21 = CONCAT41(uVar23,uVar20);
        uVar19 = CONCAT51(uVar21,uVar18);
        uVar17 = CONCAT61(uVar19,uVar16);
        local_78._0_4_ = (undefined4)uVar8;
        local_78._9_2_ = (undefined2)uVar17;
        local_78._12_2_ = (undefined2)uVar23;
        local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78._4_4_ = uVar8._4_4_;
        local_78[8] = uVar15;
        local_78[0xb] = uVar20;
        local_78[0xe] = uVar26;
        local_78[0xf] = uVar28;
        ReadBinaryIr("<text>",_Var30._M_head_impl[5]._vptr_ScriptModule,
                     *(long *)&_Var30._M_head_impl[5].type_ -
                     (long)_Var30._M_head_impl[5]._vptr_ScriptModule,(ReadBinaryOptions *)local_78,
                     &local_98,out_module);
        std::__cxx11::string::_M_assign((string *)(pCVar34 + 3));
        pEVar31 = local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pp_Var4 = _Var30._M_head_impl[1]._vptr_ScriptModule;
        SVar29 = _Var30._M_head_impl[1].type_;
        uVar6 = *(undefined4 *)&_Var30._M_head_impl[1].field_0xc;
        SVar1 = _Var30._M_head_impl[2].type_;
        uVar5 = *(undefined4 *)&_Var30._M_head_impl[2].field_0xc;
        pCVar34[2]._vptr_Command = _Var30._M_head_impl[2]._vptr_ScriptModule;
        pCVar34[2].type = SVar1;
        *(undefined4 *)&pCVar34[2].field_0xc = uVar5;
        (out_module->loc).filename._M_len = (size_t)pp_Var4;
        pCVar34[1].type = SVar29;
        *(undefined4 *)&pCVar34[1].field_0xc = uVar6;
        local_b0 = _Var30._M_head_impl;
        for (pEVar37 = local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                       _M_impl.super__Vector_impl_data._M_start; pEVar37 != pEVar31;
            pEVar37 = pEVar37 + 1) {
          if (pEVar37->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0xd05,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar37->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x1696ec,(pEVar37->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x169707,(char *)(pEVar37->loc).field_1.field_1.offset,
                  (pEVar37->message)._M_dataplus._M_p);
          }
        }
        local_b8._M_head_impl = (ScriptModule *)0x0;
        pp_Var4 = pCVar34[0x38]._vptr_Command;
        pCVar34[0x38]._vptr_Command = (_func_int **)local_b0;
        if (pp_Var4 != (_func_int **)0x0) {
          (**(code **)(*pp_Var4 + 8))();
        }
        script = local_a0;
        pCVar2 = (local_a8->_M_t).
                 super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                 super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
        (local_a8->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
        super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar34;
        if (pCVar2 != (Command *)0x0) {
          (*pCVar2->_vptr_Command[1])();
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_98);
      }
      else if (SVar1 == Text) {
        pCVar34 = (Command *)operator_new(0x380);
        memset(pCVar34,0,0x380);
        pCVar34->type = First;
        pCVar34->_vptr_Command = (_func_int **)&PTR__ModuleCommand_0018e088;
        pCVar34[1]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[1].type = 0;
        *(undefined8 *)&pCVar34[1].field_0xc = 0;
        *(undefined8 *)((long)&pCVar34[2]._vptr_Command + 4) = 0;
        pCVar34[3]._vptr_Command = (_func_int **)(pCVar34 + 4);
        *(undefined8 *)&pCVar34[3].type = 0;
        *(undefined1 *)&pCVar34[4]._vptr_Command = 0;
        pCVar34[5]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[5].type = 0;
        pCVar34[6]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[6].type = 0;
        *(undefined8 *)&pCVar34[6].field_0xc = 0;
        *(undefined8 *)((long)&pCVar34[7]._vptr_Command + 4) = 0;
        memset(pCVar34 + 8,0,0x108);
        *(CommandType **)&pCVar34[0x18].type = &pCVar34[0x1b].type;
        pCVar34[0x19]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x19].type = 0;
        pCVar34[0x1a]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x1a].type = 0x3f800000;
        pCVar34[0x1b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x1b].type = 0;
        pCVar34[0x1c]._vptr_Command = (_func_int **)(pCVar34 + 0x1f);
        *(undefined8 *)&pCVar34[0x1c].type = 1;
        pCVar34[0x1d]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x1d].type = 0;
        *(undefined4 *)&pCVar34[0x1e]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x1e].type = 0;
        pCVar34[0x1f]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x1f].type = &pCVar34[0x22].type;
        pCVar34[0x20]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x20].type = 0;
        pCVar34[0x21]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x21].type = 0x3f800000;
        pCVar34[0x22]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x22].type = 0;
        pCVar34[0x23]._vptr_Command = (_func_int **)(pCVar34 + 0x26);
        *(undefined8 *)&pCVar34[0x23].type = 1;
        pCVar34[0x24]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x24].type = 0;
        *(undefined4 *)&pCVar34[0x25]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x25].type = 0;
        pCVar34[0x26]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x26].type = &pCVar34[0x29].type;
        pCVar34[0x27]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x27].type = 0;
        pCVar34[0x28]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x28].type = 0x3f800000;
        pCVar34[0x29]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x29].type = 0;
        pCVar34[0x2a]._vptr_Command = (_func_int **)(pCVar34 + 0x2d);
        *(undefined8 *)&pCVar34[0x2a].type = 1;
        pCVar34[0x2b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x2b].type = 0;
        *(undefined4 *)&pCVar34[0x2c]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x2c].type = 0;
        pCVar34[0x2d]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x2d].type = &pCVar34[0x30].type;
        pCVar34[0x2e]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x2e].type = 0;
        pCVar34[0x2f]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x2f].type = 0x3f800000;
        pCVar34[0x30]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x30].type = 0;
        pCVar34[0x31]._vptr_Command = (_func_int **)(pCVar34 + 0x34);
        *(undefined8 *)&pCVar34[0x31].type = 1;
        pCVar34[0x32]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x32].type = 0;
        *(undefined4 *)&pCVar34[0x33]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar34[0x33].type = 0;
        pCVar34[0x34]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar34[0x34].type = &pCVar34[0x37].type;
        pCVar34[0x35]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar34[0x35].type = 0;
        pCVar34[0x36]._vptr_Command = (_func_int **)0x0;
        pCVar34[0x36].type = 0x3f800000;
        pCVar34[0x37]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar34[0x37].type = 0;
        if ((_Var30._M_head_impl)->type_ != Text) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::TextScriptModule, Base = wabt::ScriptModule]"
          ;
          goto LAB_001311c9;
        }
        out_module = (Module *)(pCVar34 + 1);
        Module::operator=(out_module,(Module *)(_Var30._M_head_impl + 1));
        pCVar2 = (out_command->_M_t).
                 super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                 super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
        (out_command->_M_t).
        super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
        super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar34;
        if (pCVar2 != (Command *)0x0) {
          (*pCVar2->_vptr_Command[1])();
        }
      }
      else {
        out_module = (Module *)0x0;
      }
      RVar33.enum_ = Ok;
      if (script != (Script *)0x0) {
        IVar35 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if ((out_module->name)._M_string_length != 0) {
          local_78._0_4_ = *(undefined4 *)&(out_module->loc).filename._M_len;
          local_78._4_4_ = *(undefined4 *)((long)&(out_module->loc).filename._M_len + 4);
          uVar5 = *(undefined4 *)&(out_module->loc).filename._M_str;
          uVar6 = *(undefined4 *)((long)&(out_module->loc).filename._M_str + 4);
          iVar7 = (out_module->loc).field_1.field_0.line;
          local_78._20_4_ = (out_module->loc).field_1.field_0.first_column;
          local_78._24_8_ = *(undefined8 *)((long)&(out_module->loc).field_1 + 8);
          local_78._16_2_ = (undefined2)iVar7;
          local_78._18_2_ = (undefined2)((uint)iVar7 >> 0x10);
          local_78[8] = (undefined1)uVar5;
          local_78._9_2_ = (undefined2)((uint)uVar5 >> 8);
          local_78[0xb] = (undefined1)((uint)uVar5 >> 0x18);
          local_78._12_2_ = (undefined2)uVar6;
          local_78[0xe] = (undefined1)((uint)uVar6 >> 0x10);
          local_78[0xf] = (undefined1)((uint)uVar6 >> 0x18);
          local_58[0] = (long *)CONCAT44(local_58[0]._4_4_,IVar35);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,0,&out_module->name);
        }
        this->last_module_index_ = IVar35;
        RVar33.enum_ = Ok;
      }
    }
  }
  if (local_b8._M_head_impl != (ScriptModule *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar33.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, module);
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}